

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void enable_sources(vw *all,bool quiet,size_t passes,input_options *input_options)

{
  options_i *poVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  _Ios_Openmode _Var6;
  __pid_t _Var7;
  ostream *poVar8;
  int *piVar9;
  char *pcVar10;
  undefined8 uVar11;
  void *pvVar12;
  size_t sVar13;
  long in_RCX;
  ulong in_RDX;
  byte in_SIL;
  vw *in_RDI;
  stringstream __msg_7;
  exception *ex;
  string temp;
  char __errmsg_3 [256];
  stringstream __msg_6;
  int f;
  socklen_t size;
  sockaddr_in client_address;
  size_t i_2;
  size_t i_1;
  pid_t pid;
  int status;
  sigaction sa;
  size_t i;
  v_array<int> children;
  size_t num_children;
  shared_data *sd;
  stringstream __msg_5;
  ofstream pid_file;
  char __errmsg_2 [256];
  stringstream __msg_4;
  stringstream __msg_3;
  ofstream port_file;
  socklen_t address_size;
  char __errmsg_1 [256];
  stringstream __msg_2;
  char __errmsg [256];
  stringstream __msg_1;
  unsigned_short port;
  sockaddr_in address;
  int enableTKA;
  int on;
  stringstream __msg;
  stringstream msg;
  shared_ptr<json_parser<false>_> *in_stack_ffffffffffffe4f8;
  parameters *in_stack_ffffffffffffe500;
  io_buf *in_stack_ffffffffffffe508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe510;
  string *in_stack_ffffffffffffe518;
  int in_stack_ffffffffffffe524;
  char *in_stack_ffffffffffffe528;
  io_buf *in_stack_ffffffffffffe530;
  undefined7 in_stack_ffffffffffffe548;
  undefined1 in_stack_ffffffffffffe54f;
  byte bVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe550;
  undefined4 in_stack_ffffffffffffe564;
  undefined2 uVar15;
  undefined4 in_stack_ffffffffffffe568;
  undefined4 in_stack_ffffffffffffe56c;
  vw *in_stack_ffffffffffffe570;
  undefined8 in_stack_ffffffffffffe668;
  vw_ostream *pvVar16;
  vw *in_stack_ffffffffffffe670;
  stringstream local_1950 [16];
  stringstream local_1940 [40];
  size_t in_stack_ffffffffffffe6e8;
  v_array<int> *in_stack_ffffffffffffe6f0;
  string local_17a0 [32];
  int local_1780;
  undefined1 local_1779;
  char local_1758 [264];
  stringstream local_1650 [16];
  ostream local_1640;
  int local_14c8 [2];
  sockaddr local_14c0;
  size_t local_14b0;
  size_t local_14a8;
  __pid_t local_14a0;
  undefined1 local_149c [4];
  sigaction local_1498;
  ulong local_1400;
  v_array<int> local_13f8;
  ulong local_13d8;
  shared_data *local_13d0;
  undefined1 local_13c1;
  stringstream local_13a0 [16];
  ostream local_1390;
  char local_1218 [519];
  allocator local_1011;
  string local_1010 [39];
  undefined1 local_fe9;
  char local_fc8 [264];
  stringstream local_ec0 [16];
  ostream local_eb0;
  undefined1 local_d31;
  stringstream local_d10 [16];
  ostream local_d00;
  char local_b88 [512];
  socklen_t local_988;
  allocator local_981;
  string local_980 [39];
  undefined1 local_959;
  char local_938 [256];
  stringstream local_838 [16];
  ostream local_828;
  undefined1 local_6a9;
  char local_688 [256];
  stringstream local_588 [16];
  ostream local_578;
  allocator local_3f9;
  string local_3f8 [34];
  uint16_t local_3d6;
  sockaddr local_3d4;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined1 local_3b9;
  string local_398 [32];
  stringstream local_378 [16];
  ostream local_368;
  string local_1f0 [32];
  stringstream local_1d0 [16];
  ostream local_1c0;
  long local_20;
  ulong local_18;
  byte local_9;
  vw *local_8;
  
  uVar15 = (undefined2)((uint)in_stack_ffffffffffffe564 >> 0x10);
  local_9 = in_SIL & 1;
  in_RDI->p->input->current = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffe550,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffe54f,in_stack_ffffffffffffe548));
  parse_cache(in_stack_ffffffffffffe570,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffe56c,in_stack_ffffffffffffe568),
              SUB21((ushort)uVar15 >> 8,0),SUB21(uVar15,0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffe510);
  if (((local_8->daemon & 1U) == 0) && ((local_8->active & 1U) == 0)) {
    sVar13 = v_array<int>::size(&local_8->p->input->files);
    if (sVar13 == 0) {
      std::__cxx11::string::string(local_17a0,(string *)&local_8->data_filename);
      if ((local_9 & 1) == 0) {
        poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"Reading datafile = ");
        poVar8 = std::operator<<(poVar8,local_17a0);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      in_stack_ffffffffffffe530 = local_8->p->input;
      uVar11 = std::__cxx11::string::c_str();
      (*(code *)**(undefined8 **)&in_stack_ffffffffffffe530->_vptr_io_buf)
                (in_stack_ffffffffffffe530,uVar11,local_8->stdin_off & 1,1);
      if (((*(byte *)(local_20 + 0x70) & 1) == 0) && ((*(byte *)(local_20 + 0x71) & 1) == 0)) {
        local_8->p->reader = read_features_string;
        local_8->p->text_reader = VW::read_lines;
      }
      else {
        if (((local_8->audit & 1U) == 0) && ((local_8->hash_inv & 1U) == 0)) {
          local_8->p->reader = read_features_json<false>;
          local_8->p->text_reader = line_to_examples_json<false>;
          local_8->p->audit = false;
          std::make_shared<json_parser<false>>();
          std::shared_ptr<void>::operator=
                    ((shared_ptr<void> *)in_stack_ffffffffffffe500,in_stack_ffffffffffffe4f8);
          std::shared_ptr<json_parser<false>_>::~shared_ptr
                    ((shared_ptr<json_parser<false>_> *)0x265d87);
        }
        else {
          local_8->p->reader = read_features_json<true>;
          local_8->p->text_reader = line_to_examples_json<true>;
          local_8->p->audit = true;
          std::make_shared<json_parser<true>>();
          std::shared_ptr<void>::operator=
                    ((shared_ptr<void> *)in_stack_ffffffffffffe500,
                     (shared_ptr<json_parser<true>_> *)in_stack_ffffffffffffe4f8);
          std::shared_ptr<json_parser<true>_>::~shared_ptr
                    ((shared_ptr<json_parser<true>_> *)0x265cfa);
        }
        local_8->p->decision_service_json = (bool)(*(byte *)(local_20 + 0x71) & 1);
      }
      local_8->p->resettable = (bool)(local_8->p->write_cache & 1);
      std::__cxx11::string::~string(local_17a0);
    }
    else if ((local_9 & 1) == 0) {
      poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,
                               "ignoring text input in favor of cache input");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    iVar4 = socket(2,1,0);
    local_8->p->bound_sock = iVar4;
    if (local_8->p->bound_sock < 0) {
      std::__cxx11::stringstream::stringstream(local_1d0);
      poVar8 = std::operator<<(&local_1c0,"socket: ");
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      std::operator<<(poVar8,pcVar10);
      pvVar16 = &local_8->trace_message;
      std::__cxx11::stringstream::str();
      poVar8 = std::operator<<(&pvVar16->super_ostream,local_1f0);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::stringstream::stringstream(local_378);
      std::__cxx11::stringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      std::operator<<(&local_368,pcVar10);
      std::__cxx11::string::~string(local_398);
      local_3b9 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                 in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
      local_3b9 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_3c0 = 1;
    iVar4 = setsockopt(local_8->p->bound_sock,1,2,&local_3c0,4);
    if (iVar4 < 0) {
      poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"setsockopt SO_REUSEADDR: ");
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      poVar8 = std::operator<<(poVar8,pcVar10);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    local_3c4 = 1;
    iVar4 = setsockopt(local_8->p->bound_sock,1,9,&local_3c4,4);
    if (iVar4 < 0) {
      poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"setsockopt SO_KEEPALIVE: ");
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      poVar8 = std::operator<<(poVar8,pcVar10);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    local_3d4.sa_family = 2;
    local_3d4.sa_data._2_4_ = htonl(0);
    local_3d6 = 0x67ae;
    poVar1 = local_8->options;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"port",&local_3f9);
    uVar5 = (*poVar1->_vptr_options_i[1])(poVar1,local_3f8);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    if ((uVar5 & 1) != 0) {
      local_3d6 = (uint16_t)*(undefined8 *)(local_20 + 8);
    }
    local_3d4.sa_data._0_2_ = htons(local_3d6);
    iVar4 = bind(local_8->p->bound_sock,&local_3d4,0x10);
    if (iVar4 < 0) {
      std::__cxx11::stringstream::stringstream(local_588);
      std::operator<<(&local_578,"bind");
      piVar9 = __errno_location();
      pcVar10 = strerror_r(*piVar9,local_688,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar8 = std::operator<<(&local_578,"errno = ");
        std::operator<<(poVar8,local_688);
      }
      else {
        std::operator<<(&local_578,"errno = unknown");
      }
      local_6a9 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                 in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
      local_6a9 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar4 = listen(local_8->p->bound_sock,1);
    if (iVar4 < 0) {
      std::__cxx11::stringstream::stringstream(local_838);
      std::operator<<(&local_828,"listen");
      piVar9 = __errno_location();
      pcVar10 = strerror_r(*piVar9,local_938,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar8 = std::operator<<(&local_828,"errno = ");
        std::operator<<(poVar8,local_938);
      }
      else {
        std::operator<<(&local_828,"errno = unknown");
      }
      local_959 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                 in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
      local_959 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    poVar1 = local_8->options;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_980,"port_file",&local_981);
    uVar5 = (*poVar1->_vptr_options_i[1])(poVar1,local_980);
    std::__cxx11::string::~string(local_980);
    std::allocator<char>::~allocator((allocator<char> *)&local_981);
    if ((uVar5 & 1) != 0) {
      local_988 = 0x10;
      iVar4 = getsockname(local_8->p->bound_sock,&local_3d4,&local_988);
      if (iVar4 < 0) {
        poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"getsockname: ");
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        poVar8 = std::operator<<(poVar8,pcVar10);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      std::ofstream::ofstream(local_b88);
      _Var6 = std::__cxx11::string::c_str();
      std::ofstream::open(local_b88,_Var6);
      bVar14 = std::ofstream::is_open();
      if ((bVar14 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_d10);
        poVar8 = std::operator<<(&local_d00,"error writing port file: ");
        std::operator<<(poVar8,(string *)(local_20 + 0x30));
        local_d31 = 1;
        uVar11 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                   in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
        local_d31 = 0;
        __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      uVar3 = ntohs(local_3d4.sa_data._0_2_);
      pvVar12 = (void *)std::ostream::operator<<(local_b88,uVar3);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
      std::ofstream::~ofstream(local_b88);
    }
    if ((((*(byte *)(local_20 + 1) & 1) == 0) && ((local_8->active & 1U) == 0)) &&
       (iVar4 = daemon(1,1), iVar4 != 0)) {
      std::__cxx11::stringstream::stringstream(local_ec0);
      std::operator<<(&local_eb0,"daemon");
      piVar9 = __errno_location();
      pcVar10 = strerror_r(*piVar9,local_fc8,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar8 = std::operator<<(&local_eb0,"errno = ");
        std::operator<<(poVar8,local_fc8);
      }
      else {
        std::operator<<(&local_eb0,"errno = unknown");
      }
      local_fe9 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                 in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
      local_fe9 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    poVar1 = local_8->options;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1010,"pid_file",&local_1011);
    uVar5 = (*poVar1->_vptr_options_i[1])(poVar1,local_1010);
    std::__cxx11::string::~string(local_1010);
    std::allocator<char>::~allocator((allocator<char> *)&local_1011);
    if ((uVar5 & 1) != 0) {
      std::ofstream::ofstream(local_1218);
      _Var6 = std::__cxx11::string::c_str();
      std::ofstream::open(local_1218,_Var6);
      bVar14 = std::ofstream::is_open();
      if ((bVar14 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_13a0);
        std::operator<<(&local_1390,"error writing pid file");
        local_13c1 = 1;
        uVar11 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                   in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
        local_13c1 = 0;
        __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      _Var7 = getpid();
      pvVar12 = (void *)std::ostream::operator<<(local_1218,_Var7);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
      std::ofstream::~ofstream(local_1218);
    }
    if (((local_8->daemon & 1U) != 0) && ((local_8->active & 1U) == 0)) {
      fclose(_stdin);
      vw::length(local_8);
      parameters::share(in_stack_ffffffffffffe500,(size_t)in_stack_ffffffffffffe4f8);
      local_13d0 = (shared_data *)mmap64((void *)0x0,0xe0,3,0x21,-1,0);
      memcpy(local_13d0,local_8->sd,0xe0);
      free(local_8->sd);
      local_8->sd = local_13d0;
      local_13d8 = local_8->num_children;
      v_init<int>();
      v_array<int>::resize(in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6e8);
      local_1400 = 0;
      do {
        if (local_13d8 <= local_1400) {
          memset(&local_1498,0,0x98);
          local_1498.__sigaction_handler.sa_handler = handle_sigterm;
          sigaction(0xf,&local_1498,(sigaction *)0x0);
          do {
            do {
              local_14a0 = wait(local_149c);
              if ((got_sigterm & 1U) != 0) {
                for (local_14a8 = 0; local_14a8 < local_13d8; local_14a8 = local_14a8 + 1) {
                  piVar9 = v_array<int>::operator[](&local_13f8,local_14a8);
                  kill(*piVar9,0xf);
                }
                VW::finish(in_stack_ffffffffffffe670,
                           SUB81((ulong)in_stack_ffffffffffffe668 >> 0x38,0));
                exit(0);
              }
            } while (local_14a0 < 0);
            for (local_14b0 = 0; local_14b0 < local_13d8; local_14b0 = local_14b0 + 1) {
              _Var7 = local_14a0;
              piVar9 = v_array<int>::operator[](&local_13f8,local_14b0);
              if (_Var7 == *piVar9) {
                _Var7 = fork();
                piVar9 = v_array<int>::operator[](&local_13f8,local_14b0);
                *piVar9 = _Var7;
                if (_Var7 == 0) {
                  local_8->quiet = (local_8->quiet & 1U) != 0 || local_14b0 != 0;
                  goto LAB_002655bb;
                }
                break;
              }
            }
          } while( true );
        }
        _Var7 = fork();
        piVar9 = v_array<int>::operator[](&local_13f8,local_1400);
        *piVar9 = _Var7;
        if (_Var7 == 0) {
          local_8->quiet = (local_8->quiet & 1U) != 0 || local_1400 != 0;
          break;
        }
        local_1400 = local_1400 + 1;
      } while( true );
    }
LAB_002655bb:
    local_14c8[1] = 0x10;
    local_8->p->max_fd = 0;
    if ((local_8->quiet & 1U) == 0) {
      poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"calling accept");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    local_1780 = accept(local_8->p->bound_sock,&local_14c0,(socklen_t *)(local_14c8 + 1));
    local_14c8[0] = local_1780;
    if (local_1780 < 0) {
      std::__cxx11::stringstream::stringstream(local_1650);
      std::operator<<(&local_1640,"accept");
      piVar9 = __errno_location();
      pcVar10 = strerror_r(*piVar9,local_1758,0x100);
      if (pcVar10 == (char *)0x0) {
        poVar8 = std::operator<<(&local_1640,"errno = ");
        std::operator<<(poVar8,local_1758);
      }
      else {
        std::operator<<(&local_1640,"errno = unknown");
      }
      local_1779 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
                 in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
      local_1779 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8->p->label_sock = local_1780;
    local_8->print = print_result;
    v_array<int>::push_back
              ((v_array<int> *)in_stack_ffffffffffffe500,(int *)in_stack_ffffffffffffe4f8);
    v_array<int>::push_back
              ((v_array<int> *)in_stack_ffffffffffffe500,(int *)in_stack_ffffffffffffe4f8);
    piVar9 = std::max<int>(local_14c8,&local_8->p->max_fd);
    local_8->p->max_fd = *piVar9;
    if ((local_8->quiet & 1U) == 0) {
      poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"reading data from port ");
      pvVar12 = (void *)std::ostream::operator<<(poVar8,local_3d6);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
    }
    local_8->p->max_fd = local_8->p->max_fd + 1;
    if ((local_8->active & 1U) == 0) {
      bVar2 = isbinary(in_stack_ffffffffffffe508);
      if (bVar2) {
        local_8->p->reader = read_cached_features;
        local_8->print = binary_print_result;
      }
      else {
        local_8->p->reader = read_features_string;
      }
      local_8->p->sorted_cache = true;
    }
    else {
      local_8->p->reader = read_features_string;
    }
    bVar14 = 1;
    if ((local_8->p->write_cache & 1U) == 0) {
      bVar14 = local_8->daemon;
    }
    local_8->p->resettable = (bool)(bVar14 & 1);
  }
  if ((1 < local_18) && ((local_8->p->resettable & 1U) == 0)) {
    std::__cxx11::stringstream::stringstream(local_1950);
    std::operator<<((ostream *)(local_1950 + 0x10),
                    "need a cache file for multiple passes : try using --cache_file");
    uVar11 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,
               in_stack_ffffffffffffe524,in_stack_ffffffffffffe518);
    __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  sVar13 = v_array<int>::size(&local_8->p->input->files);
  local_8->p->input->count = sVar13;
  if (((local_9 & 1) == 0) && ((local_8->daemon & 1U) == 0)) {
    poVar8 = std::operator<<(&(local_8->trace_message).super_ostream,"num sources = ");
    sVar13 = v_array<int>::size(&local_8->p->input->files);
    pvVar12 = (void *)std::ostream::operator<<(poVar8,sVar13);
    std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void enable_sources(vw& all, bool quiet, size_t passes, input_options& input_options)
{
  all.p->input->current = 0;
  parse_cache(all, input_options.cache_files, input_options.kill_cache, quiet);

  if (all.daemon || all.active)
  {
#ifdef _WIN32
    WSAData wsaData;
    int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
    if (lastError != 0)
      THROWERRNO("WSAStartup() returned error:" << lastError);
#endif
    all.p->bound_sock = (int)socket(PF_INET, SOCK_STREAM, 0);
    if (all.p->bound_sock < 0)
    {
      stringstream msg;
      msg << "socket: " << strerror(errno);
      all.trace_message << msg.str() << endl;
      THROW(msg.str().c_str());
    }

    int on = 1;
    if (setsockopt(all.p->bound_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
      all.trace_message << "setsockopt SO_REUSEADDR: " << strerror(errno) << endl;

    // Enable TCP Keep Alive to prevent socket leaks
    int enableTKA = 1;
    if (setsockopt(all.p->bound_sock, SOL_SOCKET, SO_KEEPALIVE, (char*)&enableTKA, sizeof(enableTKA)) < 0)
      all.trace_message << "setsockopt SO_KEEPALIVE: " << strerror(errno) << endl;

    sockaddr_in address;
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = htonl(INADDR_ANY);
    short unsigned int port = 26542;
    if (all.options->was_supplied("port"))
      port = (uint16_t)input_options.port;
    address.sin_port = htons(port);

    // attempt to bind to socket
    if (::bind(all.p->bound_sock, (sockaddr*)&address, sizeof(address)) < 0)
      THROWERRNO("bind");

    // listen on socket
    if (listen(all.p->bound_sock, 1) < 0)
      THROWERRNO("listen");

    // write port file
    if (all.options->was_supplied("port_file"))
    {
      socklen_t address_size = sizeof(address);
      if (getsockname(all.p->bound_sock, (sockaddr*)&address, &address_size) < 0)
      {
        all.trace_message << "getsockname: " << strerror(errno) << endl;
      }
      ofstream port_file;
      port_file.open(input_options.port_file.c_str());
      if (!port_file.is_open())
        THROW("error writing port file: " << input_options.port_file);

      port_file << ntohs(address.sin_port) << endl;
      port_file.close();
    }

    // background process (if foreground is not set)
    if (!input_options.foreground)
    {
      // FIXME switch to posix_spawn
      if (!all.active && daemon(1, 1))
        THROWERRNO("daemon");
    }

    // write pid file
    if (all.options->was_supplied("pid_file"))
    {
      ofstream pid_file;
      pid_file.open(input_options.pid_file.c_str());
      if (!pid_file.is_open())
        THROW("error writing pid file");

      pid_file << getpid() << endl;
      pid_file.close();
    }

    if (all.daemon && !all.active)
    {
#ifdef _WIN32
      THROW("not supported on windows");
#else
      fclose(stdin);
      // weights will be shared across processes, accessible to children
      all.weights.share(all.length());

      // learning state to be shared across children
      shared_data* sd =
          (shared_data*)mmap(0, sizeof(shared_data), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS, -1, 0);
      memcpy(sd, all.sd, sizeof(shared_data));
      free(all.sd);
      all.sd = sd;

      // create children
      size_t num_children = all.num_children;
      v_array<int> children = v_init<int>();
      children.resize(num_children);
      for (size_t i = 0; i < num_children; i++)
      {
        // fork() returns pid if parent, 0 if child
        // store fork value and run child process if child
        if ((children[i] = fork()) == 0)
        {
          all.quiet |= (i > 0);
          goto child;
        }
      }

      // install signal handler so we can kill children when killed
      {
        struct sigaction sa;
        // specifically don't set SA_RESTART in sa.sa_flags, so that
        // waitid will be interrupted by SIGTERM with handler installed
        memset(&sa, 0, sizeof(sa));
        sa.sa_handler = handle_sigterm;
        sigaction(SIGTERM, &sa, nullptr);
      }

      while (true)
      {
        // wait for child to change state; if finished, then respawn
        int status;
        pid_t pid = wait(&status);
        if (got_sigterm)
        {
          for (size_t i = 0; i < num_children; i++) kill(children[i], SIGTERM);
          VW::finish(all);
          exit(0);
        }
        if (pid < 0)
          continue;
        for (size_t i = 0; i < num_children; i++)
          if (pid == children[i])
          {
            if ((children[i] = fork()) == 0)
            {
              all.quiet |= (i > 0);
              goto child;
            }
            break;
          }
      }

#endif
    }

#ifndef _WIN32
  child:
#endif
    sockaddr_in client_address;
    socklen_t size = sizeof(client_address);
    all.p->max_fd = 0;
    if (!all.quiet)
      all.trace_message << "calling accept" << endl;
    int f = (int)accept(all.p->bound_sock, (sockaddr*)&client_address, &size);
    if (f < 0)
      THROWERRNO("accept");

    all.p->label_sock = f;
    all.print = print_result;

    all.final_prediction_sink.push_back((size_t)f);

    all.p->input->files.push_back(f);
    all.p->max_fd = max(f, all.p->max_fd);
    if (!all.quiet)
      all.trace_message << "reading data from port " << port << endl;

    all.p->max_fd++;
    if (all.active)
      all.p->reader = read_features_string;
    else
    {
      if (isbinary(*(all.p->input)))
      {
        all.p->reader = read_cached_features;
        all.print = binary_print_result;
      }
      else
      {
        all.p->reader = read_features_string;
      }
      all.p->sorted_cache = true;
    }
    all.p->resettable = all.p->write_cache || all.daemon;
  }
  else
  {
    if (all.p->input->files.size() > 0)
    {
      if (!quiet)
        all.trace_message << "ignoring text input in favor of cache input" << endl;
    }
    else
    {
      string temp = all.data_filename;
      if (!quiet)
        all.trace_message << "Reading datafile = " << temp << endl;
      try
      {
        all.p->input->open_file(temp.c_str(), all.stdin_off, io_buf::READ);
      }
      catch (exception const& ex)
      {
        // when trying to fix this exception, consider that an empty temp is valid if all.stdin_off is false
        if (temp.size() != 0)
        {
          all.trace_message << "can't open '" << temp << "', sailing on!" << endl;
        }
        else
        {
          throw ex;
        }
      }

      if (input_options.json || input_options.dsjson)
      {
        // TODO: change to class with virtual method
        // --invert_hash requires the audit parser version to save the extra information.
        if (all.audit || all.hash_inv)
        {
          all.p->reader = &read_features_json<true>;
          all.p->text_reader = &line_to_examples_json<true>;
          all.p->audit = true;
          all.p->jsonp = std::make_shared<json_parser<true>>();
        }
        else
        {
          all.p->reader = &read_features_json<false>;
          all.p->text_reader = &line_to_examples_json<false>;
          all.p->audit = false;
          all.p->jsonp = std::make_shared<json_parser<false>>();
        }

        all.p->decision_service_json = input_options.dsjson;
      }
      else
      {
        all.p->reader = read_features_string;
        all.p->text_reader = VW::read_lines;
      }

      all.p->resettable = all.p->write_cache;
    }
  }

  if (passes > 1 && !all.p->resettable)
    THROW("need a cache file for multiple passes : try using --cache_file");

  all.p->input->count = all.p->input->files.size();
  if (!quiet && !all.daemon)
    all.trace_message << "num sources = " << all.p->input->files.size() << endl;
}